

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O2

void __thiscall
OpenMD::Field<OpenMD::Vector3<double>_>::writeField(Field<OpenMD::Vector3<double>_> *this)

{
  char cVar1;
  ostream *poVar2;
  pointer pvVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  Revision r;
  string local_318;
  ulong local_2f8;
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  Vector3d scaled;
  Vector3d voxelLoc;
  Vector<double,_3U> local_290;
  Mat3x3d hmat;
  ofstream fs;
  
  Snapshot::getHmat(&hmat,((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_);
  local_318._M_dataplus._M_p = (pointer)0x0;
  Vector<double,_3U>::Vector((Vector<double,_3U> *)&fs,(double *)&local_318);
  Vector<double,_3U>::Vector(&scaled.super_Vector<double,_3U>,(Vector<double,_3U> *)&fs);
  std::ofstream::ofstream(&fs,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&fs,"# ");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_StaticAnalyser).analysisType_);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&fs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_318,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_318);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_318);
    poVar2 = std::operator<<((ostream *)&fs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_318,&r);
    poVar2 = std::operator<<(poVar2,(string *)&local_318);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_318);
    poVar2 = std::operator<<((ostream *)&fs,"# selection script: \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->selectionScript_);
    std::operator<<(poVar2,"\"\n");
    std::operator<<((ostream *)&fs,"#\n");
    std::operator<<((ostream *)&fs,
                    "# Vector Field output file format has coordinates of the center\n");
    std::operator<<((ostream *)&fs,
                    "# of the voxel followed by the value of field (either vector or\n");
    std::operator<<((ostream *)&fs,"# scalar).\n");
    pvVar3 = (this->field_).
             super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar4 = *(long **)&(pvVar3->
                        super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                        )._M_impl.super__Vector_impl_data;
    uVar7 = 0;
    while (uVar7 < (ulong)((plVar4[1] - *plVar4) / 0x18)) {
      auVar8._8_4_ = (int)(uVar7 >> 0x20);
      auVar8._0_8_ = uVar7;
      auVar8._12_4_ = 0x45300000;
      scaled.super_Vector<double,_3U>.data_[2] =
           ((auVar8._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) /
           (double)(this->nBins_).super_Vector<int,_3U>.data_[2] + -0.5;
      local_2e8 = uVar7 * 0x18;
      uVar5 = 0;
      local_2f8 = uVar7;
      while (uVar5 < (ulong)(((long)(pvVar3->
                                    super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)plVar4) /
                            0x18)) {
        auVar9._8_4_ = (int)(uVar5 >> 0x20);
        auVar9._0_8_ = uVar5;
        auVar9._12_4_ = 0x45300000;
        dVar10 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
        scaled.super_Vector<double,_3U>.data_[1] =
             dVar10 / (double)(this->nBins_).super_Vector<int,_3U>.data_[1] + -0.5;
        local_2e0 = uVar5 * 0x18;
        lVar6 = 0;
        local_2f0 = uVar5;
        for (uVar7 = 0;
            uVar7 < (ulong)(((long)(this->field_).
                                   super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18
                           ); uVar7 = uVar7 + 1) {
          scaled.super_Vector<double,_3U>.data_[1] =
               dVar10 / (double)(this->nBins_).super_Vector<int,_3U>.data_[1] + -0.5;
          operator*((Vector<double,_3U> *)&local_318,(RectMatrix<double,_3U,_3U> *)&hmat,
                    &scaled.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector
                    (&voxelLoc.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_318);
          poVar2 = std::ostream::_M_insert<double>(voxelLoc.super_Vector<double,_3U>.data_[0]);
          std::operator<<(poVar2,"\t");
          poVar2 = std::ostream::_M_insert<double>(voxelLoc.super_Vector<double,_3U>.data_[1]);
          std::operator<<(poVar2,"\t");
          poVar2 = std::ostream::_M_insert<double>(voxelLoc.super_Vector<double,_3U>.data_[2]);
          std::operator<<(poVar2,"\t");
          Vector<double,_3U>::Vector
                    (&local_290,
                     (Vector<double,_3U> *)
                     (*(long *)(*(long *)((long)&(((this->field_).
                                                                                                      
                                                  super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start + lVar6)
                               + local_2e0) + local_2e8));
          (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(&local_318,this,&local_290);
          std::operator<<((ostream *)&fs,(string *)&local_318);
          std::__cxx11::string::~string((string *)&local_318);
          std::endl<char,std::char_traits<char>>((ostream *)&fs);
          pvVar3 = (this->field_).
                   super__Vector_base<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar6 = lVar6 + 0x18;
        }
        plVar4 = *(long **)&(pvVar3->
                            super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                            )._M_impl.super__Vector_impl_data;
        uVar5 = local_2f0 + 1;
      }
      uVar7 = local_2f8 + 1;
    }
  }
  std::ofstream::~ofstream(&fs);
  return;
}

Assistant:

void Field<T>::writeField() {
    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d scaled(0.0);

    std::ofstream fs(outputFilename_.c_str());
    if (fs.is_open()) {
      Revision r;
      fs << "# " << getAnalysisType() << "\n";
      fs << "# OpenMD " << r.getFullRevision() << "\n";
      fs << "# " << r.getBuildDate() << "\n";
      fs << "# selection script: \"" << selectionScript_ << "\"\n";
      fs << "#\n";
      fs << "# Vector Field output file format has coordinates of the center\n";
      fs << "# of the voxel followed by the value of field (either vector or\n";
      fs << "# scalar).\n";

      for (std::size_t k = 0; k < field_[0][0].size(); ++k) {
        scaled.z() = RealType(k) / nBins_.z() - 0.5;
        for (std::size_t j = 0; j < field_[0].size(); ++j) {
          scaled.y() = RealType(j) / nBins_.y() - 0.5;
          for (std::size_t i = 0; i < field_.size(); ++i) {
            scaled.y() = RealType(j) / nBins_.y() - 0.5;

            Vector3d voxelLoc = hmat * scaled;

            fs << voxelLoc.x() << "\t";
            fs << voxelLoc.y() << "\t";
            fs << voxelLoc.z() << "\t";

            fs << writeValue(field_[i][j][k]);

            fs << std::endl;
          }
        }
      }
    }
  }